

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O0

void __thiscall iDynTree::optimalcontrol::integrators::Integrator::~Integrator(Integrator *this)

{
  code *pcVar1;
  Integrator *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Integrator::~Integrator(){
            }